

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O3

int __thiscall re2c::Go::init(Go *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  State *x;
  bool bVar2;
  int in_EAX;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  BitMap *pBVar4;
  opt_t *poVar5;
  Dot *this_00;
  GoBitmap *this_01;
  Cpgoto *this_02;
  Span *hspan;
  uint32_t i;
  ulong uVar6;
  long lVar7;
  uint32_t hSpans;
  ulong uVar8;
  BitMap *local_48;
  State *local_38;
  
  uVar8 = (ulong)this->nSpans;
  if (uVar8 != 0) {
    hspan = this->span;
    do {
      if (0x100 < hspan->ub) goto LAB_0011e88e;
      hspan = hspan + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    hspan = (Span *)0x0;
    uVar8 = 0;
LAB_0011e88e:
    uVar6 = 0;
    lVar7 = 8;
    local_38 = (State *)0x0;
    local_48 = (BitMap *)0x0;
    iVar3 = 0;
    do {
      x = *(State **)((long)&this->span->ub + lVar7);
      if (((x->isBase == true) && (pBVar4 = BitMap::find(x), pBVar4 != (BitMap *)0x0)) &&
         (bVar2 = matches(pBVar4->go->span,pBVar4->go->nSpans,pBVar4->on,this->span,this->nSpans,
                          *(State **)((long)&this->span->ub + lVar7)), bVar2)) {
        if (local_48 == (BitMap *)0x0) {
          local_38 = *(State **)((long)&this->span->ub + lVar7);
          local_48 = pBVar4;
        }
        iVar3 = iVar3 + 1;
      }
      uVar6 = uVar6 + 1;
      uVar1 = this->nSpans;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < uVar1);
    poVar5 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
    if (poVar5->target == DOT) {
      this->type = DOT;
      this_00 = (Dot *)operator_new(0x10);
      Dot::Dot(this_00,this->span,this->nSpans,(State *)ctx);
      in_EAX = extraout_EAX;
    }
    else {
      poVar5 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      hSpans = (uint32_t)uVar8;
      if ((poVar5->gFlag == true) &&
         (poVar5 = realopt_t::operator->((realopt_t *)&DAT_0015c868),
         poVar5->cGotoThreshold <= (uVar1 - iVar3) - hSpans)) {
        this->type = CPGOTO;
        this_02 = (Cpgoto *)operator_new(0x10);
        Cpgoto::Cpgoto(this_02,this->span,this->nSpans,hspan,hSpans,*(State **)(ctx + 0x10));
        (this->info).cpgoto = this_02;
        return extraout_EAX_01;
      }
      poVar5 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
      if ((iVar3 != 0 & poVar5->bFlag) == 1) {
        this->type = BITMAP;
        this_01 = (GoBitmap *)operator_new(0x20);
        GoBitmap::GoBitmap(this_01,this->span,this->nSpans,hspan,hSpans,local_48,local_38,
                           *(State **)(ctx + 0x10));
        (this->info).bitmap = this_01;
        bUsedYYBitmap = 1;
        return 0x15d380;
      }
      this->type = SWITCH_IF;
      this_00 = (Dot *)operator_new(0x10);
      SwitchIf::SwitchIf((SwitchIf *)this_00,this->span,this->nSpans,*(State **)(ctx + 0x10));
      in_EAX = extraout_EAX_00;
    }
    (this->info).dot = this_00;
  }
  return in_EAX;
}

Assistant:

void Go::init (const State * from)
{
	if (nSpans == 0)
	{
		return;
	}

	// initialize high (wide) spans
	uint32_t hSpans = 0;
	const Span * hspan = NULL;
	for (uint32_t i = 0; i < nSpans; ++i)
	{
		if (span[i].ub > 0x100)
		{
			hspan = &span[i];
			hSpans = nSpans - i;
			break;
		}
	}

	// initialize bitmaps
	uint32_t nBitmaps = 0;
	const BitMap * bitmap = NULL;
	const State * bitmap_state = NULL;
	for (uint32_t i = 0; i < nSpans; ++i)
	{
		if (span[i].to->isBase)
		{
			const BitMap *b = BitMap::find (span[i].to);
			if (b && matches(b->go->span, b->go->nSpans, b->on, span, nSpans, span[i].to))
			{
				if (bitmap == NULL)
				{
					bitmap = b;
					bitmap_state = span[i].to;
				}
				nBitmaps++;
			}
		}
	}

	const uint32_t dSpans = nSpans - hSpans - nBitmaps;
	if (opts->target == opt_t::DOT)
	{
		type = DOT;
		info.dot = new Dot (span, nSpans, from);
	}
	else if (opts->gFlag && (dSpans >= opts->cGotoThreshold))
	{
		type = CPGOTO;
		info.cpgoto = new Cpgoto (span, nSpans, hspan, hSpans, from->next);
	}
	else if (opts->bFlag && (nBitmaps > 0))
	{
		type = BITMAP;
		info.bitmap = new GoBitmap (span, nSpans, hspan, hSpans, bitmap, bitmap_state, from->next);
		bUsedYYBitmap = true;
	}
	else
	{
		type = SWITCH_IF;
		info.switchif = new SwitchIf (span, nSpans, from->next);
	}
}